

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void QPDFJob::parse_object_id(string *objspec,bool *trailer,int *obj,int *gen)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *local_40 [4];
  
  bVar1 = std::operator==(objspec,"trailer");
  if (bVar1) {
    *trailer = true;
  }
  else {
    *trailer = false;
    iVar2 = QUtil::string_to_int((objspec->_M_dataplus)._M_p);
    *obj = iVar2;
    lVar3 = std::__cxx11::string::find((char)objspec,0x2c);
    if ((lVar3 != -1) && (lVar3 + 1U < objspec->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)objspec);
      iVar2 = QUtil::string_to_int(local_40[0]);
      *gen = iVar2;
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return;
}

Assistant:

void
QPDFJob::parse_object_id(std::string const& objspec, bool& trailer, int& obj, int& gen)
{
    if (objspec == "trailer") {
        trailer = true;
    } else {
        trailer = false;
        obj = QUtil::string_to_int(objspec.c_str());
        size_t comma = objspec.find(',');
        if ((comma != std::string::npos) && (comma + 1 < objspec.length())) {
            gen = QUtil::string_to_int(objspec.substr(1 + comma, std::string::npos).c_str());
        }
    }
}